

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O3

from_chars_result_t<char>
fast_float::from_chars<long,char,int>(char *first,char *last,long *value,int base)

{
  char cVar1;
  byte *pbVar2;
  byte *pbVar3;
  undefined8 uVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  from_chars_result_t<char> fVar10;
  
  uVar4 = 0x16;
  if (base - 0x25U < 0xffffffdd || first == last) goto LAB_00131f2b;
  cVar1 = *first;
  pbVar5 = (byte *)(first + (cVar1 == '-'));
  pbVar3 = pbVar5;
  for (pbVar2 = pbVar5; (pbVar2 != (byte *)last && (pbVar3 = pbVar2, *pbVar2 == 0x30));
      pbVar2 = pbVar2 + 1) {
    pbVar3 = (byte *)last;
  }
  uVar8 = 0;
  pbVar2 = pbVar3;
  if ((base == 10) && (lVar9 = (long)last - (long)pbVar3, 7 < lVar9)) {
    uVar8 = 0;
    do {
      uVar6 = *(long *)pbVar2 + 0xcfcfcfcfcfcfcfd0;
      if (((*(long *)pbVar2 + 0x4646464646464646U | uVar6) & 0x8080808080808080) != 0) break;
      uVar6 = (uVar6 >> 8) + uVar6 * 10;
      uVar8 = ((uVar6 >> 0x10 & 0xff000000ff) * 0x271000000001 +
               (uVar6 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar8 * 100000000;
      pbVar2 = pbVar2 + 8;
      lVar9 = lVar9 + -8;
    } while (7 < lVar9);
  }
  pbVar7 = pbVar2;
  if (pbVar2 != (byte *)last) {
    do {
      pbVar7 = pbVar2;
      if (base <= (int)(uint)int_luts<void>::chdigit[*pbVar2]) break;
      uVar8 = uVar8 * (uint)base + (ulong)int_luts<void>::chdigit[*pbVar2];
      pbVar2 = pbVar2 + 1;
      pbVar7 = (byte *)last;
    } while (pbVar2 != (byte *)last);
  }
  if (pbVar7 == pbVar3) {
    uVar4 = 0x16;
    if (pbVar3 <= pbVar5) goto LAB_00131f2b;
    uVar6 = 0;
  }
  else {
    uVar4 = 0x22;
    first = (char *)pbVar7;
    if (*(ulong *)(int_luts<void>::chdigit + (long)base * 8 + 0xf0) <
        (ulong)((long)pbVar7 - (long)pbVar3)) goto LAB_00131f2b;
    if ((long)pbVar7 - (long)pbVar3 == *(ulong *)(int_luts<void>::chdigit + (long)base * 8 + 0xf0))
    {
      uVar6 = 0x8000000000000000;
      if (cVar1 != '-') {
        uVar6 = 0x7fffffffffffffff;
      }
      if (uVar8 < int_luts<void>::min_safe_u64[(long)base + -2]) goto LAB_00131f2b;
    }
    else {
      uVar6 = 0x8000000000000000;
      if (cVar1 != '-') {
        uVar6 = 0x7fffffffffffffff;
      }
    }
    if (uVar6 < uVar8) goto LAB_00131f2b;
    uVar6 = -uVar8;
    if (cVar1 != '-') {
      uVar6 = uVar8;
    }
  }
  *value = uVar6;
  uVar4 = 0;
  first = (char *)pbVar7;
LAB_00131f2b:
  fVar10._8_8_ = uVar4;
  fVar10.ptr = first;
  return fVar10;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars(UC const* first, UC const* last, T& value, int base) noexcept {
  static_assert (is_supported_char_type<UC>(), "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last || base < 2 || base > 36) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  return parse_int_string(first, last, value, base);
}